

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Low_options>_>::increment
          (Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Low_options>_> *this)

{
  Siblings *pSVar1;
  Siblings *pSVar2;
  pointer ppVar3;
  pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
  *local_18;
  
  boost::container::
  vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_true>
  ::operator++(&this->sh_);
  pSVar1 = this->sib_;
  ppVar3 = (pointer)(this->sh_).m_ptr;
  if (ppVar3 == (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) {
    if (pSVar1->oncles_ ==
        (Simplex_tree_siblings<Gudhi::Simplex_tree<Low_options>,_boost::container::flat_map<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>,_std::less<unsigned_char>,_void>_>
         *)0x0) {
      this->st_ = (Simplex_tree<Low_options> *)0x0;
    }
    else {
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_boost::container::dtl::select1st<unsigned_char>,_std::less<unsigned_char>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_boost::container::dtl::select1st<unsigned_char>,_std::less<unsigned_char>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>_>
              *)&local_18,(key_type *)&pSVar1->oncles_->members_);
      (this->sh_).m_ptr = local_18;
      this->sib_ = this->sib_->oncles_;
    }
  }
  else {
    while (pSVar2 = (ppVar3->second).children_, pSVar2->parent_ == ppVar3->first) {
      this->sib_ = pSVar2;
      ppVar3 = (pSVar2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      (this->sh_).m_ptr =
           (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
            *)ppVar3;
    }
  }
  return;
}

Assistant:

void increment() {
    ++sh_;
    if (sh_ == sib_->members().end()) {
      if (sib_->oncles() == nullptr) {
        st_ = nullptr;
        return;
      }  // reach the end
      sh_ = sib_->oncles()->members().find(sib_->parent());
      sib_ = sib_->oncles();
      return;
    }
    while (st_->has_children(sh_)) {
      sib_ = sh_->second.children();
      sh_ = sib_->members().begin();
    }
  }